

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_property.h
# Opt level: O2

void dukglue_register_property<true,MyClass,int,int>
               (duk_context *ctx,type getter,type setter,char *name)

{
  type *val;
  undefined8 *val_00;
  undefined8 in_R8;
  char *in_R9;
  
  dukglue::detail::ProtoManager::push_prototype<MyClass>(ctx);
  duk_push_string(ctx,in_R9);
  if (getter == 0) {
    duk_push_c_function(ctx,dukglue_throw_error,1);
  }
  else {
    duk_push_c_function(ctx,dukglue::detail::MethodInfo<true,_MyClass,_int>::MethodRuntime::
                            call_native_method,0);
    val = (type *)operator_new(0x10);
    *val = getter;
    val[1] = setter;
    duk_push_pointer(ctx,val);
    duk_put_prop_string(ctx,-2,anon_var_dwarf_df54);
    duk_push_c_function(ctx,dukglue::detail::MethodInfo<true,_MyClass,_int>::MethodRuntime::
                            finalize_method,1);
    duk_set_finalizer(ctx,-2);
  }
  if (name == (char *)0x0) {
    duk_push_c_function(ctx,dukglue_throw_error,1);
  }
  else {
    duk_push_c_function(ctx,dukglue::detail::MethodInfo<false,_MyClass,_void,_int>::MethodRuntime::
                            call_native_method,1);
    val_00 = (undefined8 *)operator_new(0x10);
    *val_00 = name;
    val_00[1] = in_R8;
    duk_push_pointer(ctx,val_00);
    duk_put_prop_string(ctx,-2,anon_var_dwarf_df54);
    duk_push_c_function(ctx,dukglue::detail::MethodInfo<false,_MyClass,_void,_int>::MethodRuntime::
                            finalize_method,1);
    duk_set_finalizer(ctx,-2);
  }
  duk_def_prop(ctx,-4,0x3a0);
  duk_pop(ctx);
  return;
}

Assistant:

void dukglue_register_property(duk_context* ctx,
	typename std::conditional<isConstGetter, RetT(Cls::*)() const, RetT(Cls::*)()>::type getter,
	void(Cls::*setter)(ArgT),
	const char* name)
{
	using namespace dukglue::detail;
	typedef MethodInfo<isConstGetter, Cls, RetT> GetterMethodInfo;
	typedef MethodInfo<false, Cls, void, ArgT> SetterMethodInfo;

	ProtoManager::push_prototype<Cls>(ctx);

	// push key
	duk_push_string(ctx, name);

	// push getter
	if (getter != nullptr) {
		duk_c_function method_func = GetterMethodInfo::MethodRuntime::call_native_method;

		duk_push_c_function(ctx, method_func, 0);

		duk_push_pointer(ctx, new typename GetterMethodInfo::MethodHolder{ getter });
		duk_put_prop_string(ctx, -2, "\xFF" "method_holder"); // consumes raw method pointer

		// make sure we free the method_holder when this function is removed
		duk_push_c_function(ctx, GetterMethodInfo::MethodRuntime::finalize_method, 1);
		duk_set_finalizer(ctx, -2);
	} else {
		duk_push_c_function(ctx, dukglue_throw_error, 1);
	}

	if (setter != nullptr) {
		duk_c_function method_func = SetterMethodInfo::MethodRuntime::call_native_method;

		duk_push_c_function(ctx, method_func, 1);

		duk_push_pointer(ctx, new typename SetterMethodInfo::MethodHolder{ setter });
		duk_put_prop_string(ctx, -2, "\xFF" "method_holder"); // consumes raw method pointer

		// make sure we free the method_holder when this function is removed
		duk_push_c_function(ctx, SetterMethodInfo::MethodRuntime::finalize_method, 1);
		duk_set_finalizer(ctx, -2);
	} else {
		duk_push_c_function(ctx, dukglue_throw_error, 1);
	}

	duk_uint_t flags = DUK_DEFPROP_HAVE_GETTER
		| DUK_DEFPROP_HAVE_SETTER
		| DUK_DEFPROP_HAVE_CONFIGURABLE /* set not configurable (from JS) */
		| DUK_DEFPROP_FORCE /* allow overriding built-ins and previously defined properties */;

	duk_def_prop(ctx, -4, flags);
	duk_pop(ctx);  // pop prototype
}